

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpsend.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  char **in_RSI;
  int in_EDI;
  bool bVar5;
  int elements_1;
  int elements;
  int retval;
  int datalen;
  int buflen;
  uchar buf [67000];
  __u32 force_tx_stmin;
  useconds_t usecs;
  uint loops;
  int opt;
  sockaddr_can addr;
  int s;
  int iStack_10600;
  uint uStack_105fc;
  char acStack_105f8 [67000];
  undefined4 local_40;
  __useconds_t local_3c;
  int local_38;
  uint local_34;
  sockaddr local_30;
  int local_14;
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_38 = 1;
  local_3c = 0;
  local_40 = 0;
  uStack_105fc = 0;
  iStack_10600 = 0;
  local_30.sa_data[6] = -1;
  local_30.sa_data[7] = -1;
  local_30.sa_data[8] = -1;
  local_30.sa_data[9] = -1;
  local_30.sa_data[10] = -1;
  local_30.sa_data[0xb] = -1;
  local_30.sa_data[0xc] = -1;
  local_30.sa_data[0xd] = -1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_34 = getopt(local_8,local_10,"s:d:x:p:P:t:f:D:l:g:bSCL:?"), local_34 != 0xffffffff) {
    switch(local_34) {
    case 0x3f:
      __xpg_basename(*local_10);
      print_usage((char *)0x101a0e);
      exit(0);
    default:
      fprintf(_stderr,"Unknown option %c\n",(ulong)local_34);
      __xpg_basename(*local_10);
      print_usage((char *)0x101a4c);
      exit(1);
    case 0x43:
      main::opts.flags = main::opts.flags | 0x1000;
      break;
    case 0x44:
      uVar4 = strtoul(_optarg,(char **)0x0,10);
      iStack_10600 = (int)uVar4;
      if ((iStack_10600 == 0) || (66999 < iStack_10600)) {
        __xpg_basename(*local_10);
        print_usage((char *)0x1018a2);
        exit(0);
      }
      break;
    case 0x4c:
      iVar1 = __isoc99_sscanf(_optarg,"%hhu:%hhu:%hhu",&main::llopts,0x1040c9,0x1040ca);
      if (iVar1 != 3) {
        printf("unknown link layer options \'%s\'.\n",_optarg);
        __xpg_basename(*local_10);
        print_usage((char *)0x1019ed);
        exit(0);
      }
      break;
    case 0x50:
      if (*_optarg == 'l') {
        main::opts.flags = main::opts.flags | 0x10;
      }
      else if (*_optarg == 'c') {
        main::opts.flags = main::opts.flags | 0x20;
      }
      else {
        if (*_optarg != 'a') {
          printf("unknown padding check option \'%c\'.\n",(ulong)(uint)(int)*_optarg);
          __xpg_basename(*local_10);
          print_usage((char *)0x1017c9);
          exit(0);
        }
        main::opts.flags = main::opts.flags | 0x30;
      }
      break;
    case 0x53:
      main::opts.flags = main::opts.flags | 0x800;
      break;
    case 0x62:
      main::opts.flags = main::opts.flags | 0x400;
      break;
    case 100:
      uVar4 = strtoul(_optarg,(char **)0x0,0x10);
      local_30.sa_data._6_4_ = SUB84(uVar4,0);
      sVar3 = strlen(_optarg);
      if (7 < sVar3) {
        local_30.sa_data._6_4_ = local_30.sa_data._6_4_ | 0x80000000;
      }
      break;
    case 0x66:
      main::opts.flags = main::opts.flags | 0x80;
      uVar4 = strtoul(_optarg,(char **)0x0,10);
      local_40 = (undefined4)uVar4;
      break;
    case 0x67:
      uVar4 = strtoul(_optarg,(char **)0x0,10);
      local_3c = (__useconds_t)uVar4;
      break;
    case 0x6c:
      if (*_optarg == 'i') {
        local_38 = 0;
      }
      else {
        uVar4 = strtoul(_optarg,(char **)0x0,10);
        local_38 = (int)uVar4;
        if (local_38 == 0) {
          fprintf(_stderr,"Invalid argument for option -l!\n");
          return 1;
        }
      }
      break;
    case 0x70:
      iVar1 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1040c5,0x1040c6);
      if (iVar1 == 1) {
        main::opts.flags = main::opts.flags | 4;
      }
      else if (iVar1 == 2) {
        main::opts.flags = main::opts.flags | 0xc;
      }
      else {
        iVar1 = __isoc99_sscanf(_optarg,":%hhx",0x1040c6);
        if (iVar1 != 1) {
          printf("incorrect padding values \'%s\'.\n",_optarg);
          __xpg_basename(*local_10);
          print_usage((char *)0x10171a);
          exit(0);
        }
        main::opts.flags = main::opts.flags | 8;
      }
      break;
    case 0x73:
      uVar4 = strtoul(_optarg,(char **)0x0,0x10);
      local_30.sa_data._10_4_ = SUB84(uVar4,0);
      sVar3 = strlen(_optarg);
      if (7 < sVar3) {
        local_30.sa_data._10_4_ = local_30.sa_data._10_4_ | 0x80000000;
      }
      break;
    case 0x74:
      iVar1 = strncmp(_optarg,"ZERO",4);
      if (iVar1 == 0) {
        main::opts.frame_txtime = 0xffffffff;
      }
      else {
        uVar4 = strtoul(_optarg,(char **)0x0,10);
        main::opts.frame_txtime = (__u32)uVar4;
      }
      break;
    case 0x78:
      iVar1 = __isoc99_sscanf(_optarg,"%hhx:%hhx",0x1040c4,0x1040c7);
      if (iVar1 == 1) {
        main::opts.flags = main::opts.flags | 2;
      }
      else {
        if (iVar1 != 2) {
          printf("incorrect extended addr values \'%s\'.\n",_optarg);
          __xpg_basename(*local_10);
          print_usage((char *)0x101642);
          exit(0);
        }
        main::opts.flags = main::opts.flags | 0x202;
      }
    }
  }
  if ((((local_8 - _optind != 1) || (local_30.sa_data._10_4_ == 0xffffffff)) ||
      ((main::opts.flags & 0x1800) == 0x1800)) ||
     ((local_30.sa_data._6_4_ == 0xffffffff && ((main::opts.flags & 0x1800) == 0)))) {
    __xpg_basename(*local_10);
    print_usage((char *)0x101abe);
    exit(1);
  }
  local_14 = socket(0x1d,2,6);
  if (local_14 < 0) {
    perror("socket");
    exit(1);
  }
  iVar1 = setsockopt(local_14,0x6a,1,&main::opts,0xc);
  if (iVar1 < 0) {
    perror("sockopt");
    exit(1);
  }
  if ((main::llopts.tx_dl != '\0') &&
     (iVar1 = setsockopt(local_14,0x6a,5,&main::llopts,3), iVar1 < 0)) {
    perror("link layer sockopt");
    exit(1);
  }
  if ((main::opts.flags & 0x80) != 0) {
    setsockopt(local_14,0x6a,3,&local_40,4);
  }
  local_30.sa_family = 0x1d;
  local_30.sa_data._2_4_ = if_nametoindex(local_10[_optind]);
  if (local_30.sa_data._2_4_ != 0) {
    iVar1 = bind(local_14,&local_30,0x18);
    if (iVar1 < 0) {
      perror("bind");
      close(local_14);
      exit(1);
    }
    if (iStack_10600 == 0) {
      while( true ) {
        bVar5 = false;
        if ((int)uStack_105fc < 67000) {
          iVar1 = __isoc99_scanf("%hhx",acStack_105f8 + (int)uStack_105fc);
          bVar5 = iVar1 == 1;
        }
        if (!bVar5) break;
        uStack_105fc = uStack_105fc + 1;
      }
    }
    else {
      for (uStack_105fc = 0; (int)uStack_105fc < iStack_10600; uStack_105fc = uStack_105fc + 1) {
        acStack_105f8[(int)uStack_105fc] = (char)((long)(int)uStack_105fc % 0xff) + '\x01';
      }
    }
    while( true ) {
      if (local_3c != 0) {
        usleep(local_3c);
      }
      uVar4 = write(local_14,acStack_105f8,(long)(int)uStack_105fc);
      uVar2 = (uint)uVar4;
      if ((int)uVar2 < 0) break;
      if (uVar2 != uStack_105fc) {
        fprintf(_stderr,"wrote only %d from %d byte\n",uVar4 & 0xffffffff,(ulong)uStack_105fc);
      }
      if ((local_38 != 0) && (local_38 = local_38 + -1, local_38 == 0)) {
        close(local_14);
        return 0;
      }
    }
    perror("write");
    return uVar2;
  }
  perror("if_nametoindex");
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    int s;
    struct sockaddr_can addr;
    static struct can_isotp_options opts;
    static struct can_isotp_ll_options llopts;
    int opt;
    extern int optind, opterr, optopt;
    unsigned int loops = 1; /* one (== no) loop by default */
    useconds_t usecs = 0; /* wait before sending the PDU */
    __u32 force_tx_stmin = 0;
    unsigned char buf[BUFSIZE];
    int buflen = 0;
    int datalen = 0;
    int retval = 0;

    addr.can_addr.tp.tx_id = addr.can_addr.tp.rx_id = NO_CAN_ID;

    while ((opt = getopt(argc, argv, "s:d:x:p:P:t:f:D:l:g:bSCL:?")) != -1) {
	    switch (opt) {
	    case 's':
		    addr.can_addr.tp.tx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.tx_id |= CAN_EFF_FLAG;
		    break;

	    case 'd':
		    addr.can_addr.tp.rx_id = strtoul(optarg, NULL, 16);
		    if (strlen(optarg) > 7)
			    addr.can_addr.tp.rx_id |= CAN_EFF_FLAG;
		    break;

	    case 'x':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.ext_address,
					  &opts.rx_ext_address);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_EXTEND_ADDR;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_EXTEND_ADDR | CAN_ISOTP_RX_EXT_ADDR);
		    else {
			    printf("incorrect extended addr values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'p':
	    {
		    int elements = sscanf(optarg, "%hhx:%hhx",
					  &opts.txpad_content,
					  &opts.rxpad_content);

		    if (elements == 1)
			    opts.flags |= CAN_ISOTP_TX_PADDING;
		    else if (elements == 2)
			    opts.flags |= (CAN_ISOTP_TX_PADDING | CAN_ISOTP_RX_PADDING);
		    else if (sscanf(optarg, ":%hhx", &opts.rxpad_content) == 1)
			    opts.flags |= CAN_ISOTP_RX_PADDING;
		    else {
			    printf("incorrect padding values '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;
	    }

	    case 'P':
		    if (optarg[0] == 'l')
			    opts.flags |= CAN_ISOTP_CHK_PAD_LEN;
		    else if (optarg[0] == 'c')
			    opts.flags |= CAN_ISOTP_CHK_PAD_DATA;
		    else if (optarg[0] == 'a')
			    opts.flags |= (CAN_ISOTP_CHK_PAD_LEN | CAN_ISOTP_CHK_PAD_DATA);
		    else {
			    printf("unknown padding check option '%c'.\n", optarg[0]);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case 't':
		    if (!strncmp(optarg, ZERO_STRING, strlen(ZERO_STRING)))
			    opts.frame_txtime = CAN_ISOTP_FRAME_TXTIME_ZERO;
		    else
			    opts.frame_txtime = strtoul(optarg, NULL, 10);
		    break;

	    case 'f':
		    opts.flags |= CAN_ISOTP_FORCE_TXSTMIN;
		    force_tx_stmin = strtoul(optarg, NULL, 10);
		    break;

	    case 'D':
		    datalen = strtoul(optarg, NULL, 10);
		    if (!datalen || datalen >= BUFSIZE) {
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case 'l':
		    if (optarg[0] == 'i') {
			    loops = 0; /* infinite loop */
		    } else {
			    loops = strtoul(optarg, NULL, 10);
			    if (!loops) {
				    fprintf(stderr, "Invalid argument for option -l!\n");
				    return 1;
			    }
		    }
		    break;

	    case 'g':
		    usecs = strtoul(optarg, NULL, 10);
		    break;

	    case 'b':
		    opts.flags |= CAN_ISOTP_WAIT_TX_DONE;
		    break;

	    case 'S':
		    opts.flags |= CAN_ISOTP_SF_BROADCAST;
		    break;

	    case 'C':
		    opts.flags |= CAN_ISOTP_CF_BROADCAST;
		    break;

	    case 'L':
		    if (sscanf(optarg, "%hhu:%hhu:%hhu",
			       &llopts.mtu,
			       &llopts.tx_dl,
			       &llopts.tx_flags) != 3) {
			    printf("unknown link layer options '%s'.\n", optarg);
			    print_usage(basename(argv[0]));
			    exit(0);
		    }
		    break;

	    case '?':
		    print_usage(basename(argv[0]));
		    exit(0);
		    break;

	    default:
		    fprintf(stderr, "Unknown option %c\n", opt);
		    print_usage(basename(argv[0]));
		    exit(1);
		    break;
	    }
    }

#define BC_FLAGS (CAN_ISOTP_SF_BROADCAST | CAN_ISOTP_CF_BROADCAST)

    if ((argc - optind != 1) ||
	(addr.can_addr.tp.tx_id == NO_CAN_ID) ||
	((opts.flags & BC_FLAGS) == BC_FLAGS) ||
	((addr.can_addr.tp.rx_id == NO_CAN_ID) &&
	 (!(opts.flags & BC_FLAGS)))) {
	    print_usage(basename(argv[0]));
	    exit(1);
    }

    if ((s = socket(PF_CAN, SOCK_DGRAM, CAN_ISOTP)) < 0) {
	perror("socket");
	exit(1);
    }

    if (setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_OPTS, &opts, sizeof(opts)) < 0) {
	perror("sockopt");
	exit(1);
    }


    if (llopts.tx_dl) {
	if (setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_LL_OPTS, &llopts, sizeof(llopts)) < 0) {
	    perror("link layer sockopt");
	    exit(1);
	}
    }

    if (opts.flags & CAN_ISOTP_FORCE_TXSTMIN)
	    setsockopt(s, SOL_CAN_ISOTP, CAN_ISOTP_TX_STMIN, &force_tx_stmin, sizeof(force_tx_stmin));

    addr.can_family = AF_CAN;
    addr.can_ifindex = if_nametoindex(argv[optind]);
    if (!addr.can_ifindex) {
	perror("if_nametoindex");
	exit(1);
    }

    if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
	perror("bind");
	close(s);
	exit(1);
    }

    if (!datalen) {
	    while (buflen < BUFSIZE && scanf("%hhx", &buf[buflen]) == 1)
		    buflen++;
    } else {
	    for (buflen = 0; buflen < datalen; buflen++)
		    buf[buflen] = ((buflen % 0xFF) + 1) & 0xFF;
    }

loop:
    if (usecs)
	    usleep(usecs);

    retval = write(s, buf, buflen);
    if (retval < 0) {
	    perror("write");
	    return retval;
    }

    if (retval != buflen)
	    fprintf(stderr, "wrote only %d from %d byte\n", retval, buflen);

    if (loops) {
	    if (--loops)
		    goto loop;
    } else {
	    goto loop;
    }

    /* 
     * due to a Kernel internal wait queue the PDU is sent completely
     * before close() returns.
     */
    close(s);

    return 0;
}